

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

_Deque_iterator<long,_long_&,_long_*> * __thiscall
UnitTests::OutputElement<std::_Deque_iterator<long,long&,long*>>
          (_Deque_iterator<long,_long_&,_long_*> *__return_storage_ptr__,UnitTests *this,ostream *os
          ,_Deque_iterator<long,_long_&,_long_*> *iter,_Deque_iterator<long,_long_&,_long_*> *end)

{
  _Elt_pointer plVar1;
  _Map_pointer pplVar2;
  expected_got_outputter<long> local_18;
  
  local_18.t = *(long **)os;
  if (local_18.t == iter->_M_cur) {
    std::operator<<((ostream *)this,"##EOF!##");
  }
  else {
    details::operator<<((ostream *)this,&local_18);
    os = (ostream *)
         std::_Deque_iterator<long,_long_&,_long_*>::operator++
                   ((_Deque_iterator<long,_long_&,_long_*> *)os);
  }
  plVar1 = ((_Self *)os)->_M_first;
  __return_storage_ptr__->_M_cur = ((_Self *)os)->_M_cur;
  __return_storage_ptr__->_M_first = plVar1;
  pplVar2 = ((_Self *)os)->_M_node;
  __return_storage_ptr__->_M_last = ((_Self *)os)->_M_last;
  __return_storage_ptr__->_M_node = pplVar2;
  return __return_storage_ptr__;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }